

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void duplicate_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_beep(0);
  }
  else {
    pcVar2 = cutfname(1);
    iVar1 = write_file(pcVar2,1);
    if (iVar1 == 0) {
      pcVar2 = cutfname(1);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fl_message("Can\'t write %s: %s",pcVar2,pcVar4);
    }
    else {
      pasteoffset = 0;
      force_parent = 1;
      undo_checkpoint();
      undo_suspend();
      pcVar2 = cutfname(1);
      iVar1 = read_file(pcVar2,1);
      if (iVar1 == 0) {
        pcVar2 = cutfname(1);
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fl_message("Can\'t read %s: %s",pcVar2,pcVar4);
      }
      pcVar2 = cutfname(1);
      unlink(pcVar2);
      undo_resume();
      force_parent = 0;
    }
  }
  return;
}

Assistant:

void duplicate_cb(Fl_Widget*, void*) {
  if (!Fl_Type::current) {
    fl_beep();
    return;
  }

  if (!write_file(cutfname(1),1)) {
    fl_message("Can't write %s: %s", cutfname(1), strerror(errno));
    return;
  }

  pasteoffset  = 0;
  force_parent = 1;

  undo_checkpoint();
  undo_suspend();
  if (!read_file(cutfname(1), 1)) {
    fl_message("Can't read %s: %s", cutfname(1), strerror(errno));
  }
  unlink(cutfname(1));
  undo_resume();

  force_parent = 0;
}